

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O1

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::FIBase64Decoder::decode(FIBase64Decoder *this,uint8_t *data,size_t len)

{
  long in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<const_Assimp::FIValue> sVar2;
  allocator_type local_42;
  undefined1 local_41;
  void *local_40 [2];
  long local_30;
  FIBase64Decoder local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_40,(uchar *)len,
             (uchar *)(in_RCX + len),&local_42);
  local_28 = (FIBase64Decoder)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Assimp::FIBase64ValueImpl,std::allocator<Assimp::FIBase64ValueImpl>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (a_Stack_20,(FIBase64ValueImpl **)&local_28,
             (allocator<Assimp::FIBase64ValueImpl> *)&local_41,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  *this = local_28;
  this[1] = (FIBase64Decoder)a_Stack_20[0]._M_pi;
  _Var1._M_pi = extraout_RDX;
  if (local_40[0] != (void *)0x0) {
    operator_delete(local_40[0],local_30 - (long)local_40[0]);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_Assimp::FIValue>)
         sVar2.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<const FIValue> decode(const uint8_t *data, size_t len) /*override*/ {
        return FIBase64Value::create(std::vector<uint8_t>(data, data + len));
    }